

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::initData(PeleLM *this)

{
  Geometry *a_level_geom;
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  pointer pSVar7;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  double *pdVar8;
  Real *pRVar9;
  StateData *this_02;
  MultiFab *pMVar10;
  double dVar11;
  Real RVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 auVar21 [16];
  int iVar22;
  int iVar23;
  long lVar24;
  ProbParm *pPVar25;
  ProbParm *pPVar26;
  DataContainer *pDVar27;
  undefined8 __s1;
  undefined8 __n;
  Long LVar28;
  Long LVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined4 uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  TimeCenter TVar37;
  int *piVar38;
  Array4<double> *pAVar39;
  long *plVar40;
  int n;
  double *pdVar41;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar42;
  long lVar43;
  ulong uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  ulong uVar48;
  long lVar49;
  BoxArray *pBVar50;
  undefined4 uVar51;
  uint uVar52;
  long lVar53;
  BoxArray *pBVar54;
  int i_3;
  uint uVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  uint uVar61;
  int iVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  uint uVar66;
  long lVar67;
  long lVar68;
  undefined8 *puVar69;
  bool bVar70;
  byte bVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  Real L_y;
  Real z;
  string velocity_plotfile;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plotnames;
  string pltfile;
  PltFileManager pltData;
  string firstChars;
  MFIter mfi;
  MFIter mfi_1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  MultiFab speciesPlt;
  ParmParse pp;
  int local_848;
  ulong local_7b0;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  double local_718;
  double dStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b8;
  Real local_6a0;
  string local_698;
  undefined1 local_678 [32];
  undefined8 local_658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_650;
  double local_638;
  Real RStack_630;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_628;
  pointer pGStack_610;
  pointer local_608;
  pointer pGStack_600;
  pointer local_5f8;
  undefined1 auStack_5f0 [16];
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> vStack_5e0;
  vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> local_5c8;
  undefined1 local_5a8 [24];
  Array4<double> *local_590;
  Real local_588;
  Real local_580;
  Box local_574;
  undefined1 local_558 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_548;
  double dStack_530;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double local_4b0;
  double dStack_4a8;
  double local_4a0;
  string local_3c8;
  string local_3a8;
  Array4<double> local_388;
  Real local_348;
  undefined8 uStack_340;
  undefined1 local_338 [20];
  int iStack_324;
  int local_318;
  int local_310;
  undefined1 local_2d8 [32];
  int local_2b8 [2];
  int local_2b0;
  Vector<int,_std::allocator<int>_> *local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [4];
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  element_type *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  pointer local_188;
  pointer piStack_180;
  pointer local_178;
  _Bit_type *p_Stack_170;
  undefined8 local_168;
  ParmParse local_88;
  undefined1 *__s;
  
  pPVar26 = prob_parm_d;
  pPVar25 = prob_parm;
  bVar71 = 0;
  prob_parm_d->pertmag = prob_parm->pertmag;
  uVar18 = *(undefined4 *)((long)&pPVar25->P_mean + 4);
  uVar19 = *(undefined4 *)&pPVar25->standoff;
  uVar20 = *(undefined4 *)((long)&pPVar25->standoff + 4);
  *(undefined4 *)&pPVar26->P_mean = *(undefined4 *)&pPVar25->P_mean;
  *(undefined4 *)((long)&pPVar26->P_mean + 4) = uVar18;
  *(undefined4 *)&pPVar26->standoff = uVar19;
  *(undefined4 *)((long)&pPVar26->standoff + 4) = uVar20;
  pSVar7 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar7->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       pSVar7[1].new_data._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  local_558._0_8_ = &vStack_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"peleLM","");
  amrex::ParmParse::ParmParse(&local_88,(string *)local_558);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_558._0_8_ != &vStack_548) {
    operator_delete((void *)local_558._0_8_,
                    (ulong)((long)vStack_548.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  iVar34 = amrex::ParmParse::countval(&local_88,"initDataPlt",-1);
  if (iVar34 < 1) {
    dVar4 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[0];
    local_6a0 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[1];
    local_588 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo[2];
    dVar5 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[0];
    dVar15 = (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi[1];
    dVar16 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[0];
    local_580 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[1];
    local_348 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
    uStack_340 = 0;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_00.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_01.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_01.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    pDVar27 = pmf_data.m_data_d;
    pPVar25 = prob_parm_d;
    amrex::FabArray<amrex::FArrayBox>::build_arrays<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    local_590 = ((MultiArray4<double> *)
                ((long)this_00.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x128))->hp;
    local_388.p = (double *)0x0;
    local_388.jstride._0_4_ = 0;
    local_558._4_4_ = amrex::Gpu::Device::max_gpu_streams;
    local_558._8_8_ = amrex::FabArrayBase::mfiter_tile_size;
    vStack_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vStack_548.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,DAT_00810ec0);
    local_558._0_3_ = 0x10001;
    amrex::MFIter::MFIter
              ((MFIter *)local_2d8,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFItInfo *)local_558);
    if (local_2b8[0] < local_2b0) {
      dVar5 = dVar5 - dVar4;
      dVar15 = dVar15 - local_6a0;
      local_5a8._8_4_ = SUB84(local_348 * -0.5,0);
      local_5a8._0_8_ = local_348 * 0.5;
      local_5a8._12_4_ = (int)((ulong)(local_348 * -0.5) >> 0x20);
      do {
        amrex::MFIter::growntilebox((Box *)local_338,(MFIter *)local_2d8,(IntVect *)&local_388);
        piVar38 = (int *)(local_2d8 + 0x20);
        if (local_298 != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar38 = (local_298->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_2b8[0];
        }
        iVar34 = iStack_324;
        if ((int)local_338._8_4_ <= iStack_324) {
          uVar18 = local_338._0_4_;
          uVar19 = local_338._4_4_;
          uVar20 = local_338._12_4_;
          uVar33 = local_338._16_4_;
          pAVar39 = local_590 + *piVar38;
          local_7b0 = local_338._8_8_ & 0xffffffff;
          do {
            if ((int)uVar19 <= (int)uVar33) {
              dVar17 = ((double)(int)local_7b0 + 0.5) * local_348 + local_588;
              iVar62 = uVar19;
              do {
                if ((int)uVar18 <= (int)uVar20) {
                  dVar13 = ((double)iVar62 + 0.5) * local_580 + local_6a0;
                  iVar36 = uVar18;
                  do {
                    __s = local_558;
                    memset(__s,0,200);
                    uVar51 = SUB84(__s,0);
                    dVar3 = pPVar25->pertmag;
                    dVar77 = 0.0;
                    if (0.0 < dVar3) {
                      dVar77 = ((double)iVar36 + 0.5) * dVar16 + dVar4;
                      dVar78 = sin((dVar77 * 25.132741228718345) / dVar5);
                      dVar72 = sin((dVar13 * 31.41592653589793) / dVar15);
                      dVar74 = sin(((dVar77 + -0.004598) * 12.566370614359172) / dVar5);
                      dVar79 = sin(((dVar13 + -0.0053765) * 25.132741228718345) / dVar15);
                      dVar76 = sin(((dVar77 + -0.00712435) * 18.84955592153876) / dVar5);
                      dVar73 = sin(((dVar13 + -0.02137) * 18.84955592153876) / dVar15);
                      dVar75 = sin(((dVar77 + -0.0033) * 31.41592653589793) / dVar5);
                      dVar11 = sin(((dVar13 + -0.018) * 37.69911184307752) / dVar15);
                      dVar77 = sin(((dVar77 + -0.014234) * 31.41592653589793) / dVar5);
                      dVar77 = dVar3 * (dVar77 * 0.982 +
                                       dVar11 * dVar75 * 1.017 +
                                       dVar73 * dVar76 * 0.945 +
                                       dVar72 * dVar78 + dVar79 * dVar74 * 1.023);
                    }
                    dVar78 = dVar17 - pPVar25->standoff;
                    dVar3 = (dVar77 + dVar78 + (double)local_5a8._0_8_) * 100.0;
                    dVar77 = (dVar77 + dVar78 + (double)local_5a8._8_8_) * 100.0;
                    uVar6 = pDVar27->m_nPoint;
                    uVar66 = uVar6 - 1;
                    uVar48 = (ulong)uVar66;
                    if (pDVar27->m_doAverage == 0) {
                      dVar3 = (dVar3 + dVar77) * 0.5;
                      pdVar8 = pDVar27->pmf_X;
                      uVar52 = -(uint)(*pdVar8 <= dVar3);
                      if (pdVar8[uVar48] <= dVar3 && dVar3 != pdVar8[uVar48]) {
                        uVar52 = uVar66;
                      }
                      uVar66 = uVar52;
                      if (uVar52 == 0xffffffff) {
                        if (uVar48 == 0) {
                          uVar52 = 0xffffffff;
                          uVar66 = 0xffffffff;
                        }
                        else {
                          uVar66 = 0xffffffff;
                          uVar44 = 0;
                          uVar64 = 0xffffffff;
                          do {
                            if ((pdVar8[uVar44] <= dVar3) && (dVar3 <= pdVar8[uVar44 + 1])) {
                              uVar66 = (int)uVar44 + 1;
                              uVar64 = uVar44 & 0xffffffff;
                            }
                            uVar52 = (uint)uVar64;
                            uVar44 = uVar44 + 1;
                          } while (uVar48 != uVar44);
                        }
                      }
                      uVar55 = pDVar27->m_nVar;
                      if (uVar55 != 0) {
                        dVar3 = pdVar8[(int)uVar52];
                        pRVar9 = pDVar27->pmf_Y;
                        uVar63 = 0;
                        uVar46 = uVar66;
                        uVar61 = uVar52;
                        do {
                          dVar78 = pRVar9[uVar61];
                          dVar72 = 0.0;
                          if (uVar52 != uVar66) {
                            dVar72 = (pRVar9[uVar46] - dVar78) / (pdVar8[(int)uVar66] - dVar3);
                          }
                          *(double *)(local_558 + (long)(int)uVar63 * 8) =
                               dVar72 * (dVar77 - dVar3) + dVar78;
                          uVar63 = uVar63 + 1;
                          uVar46 = uVar46 + uVar6;
                          uVar61 = uVar61 + uVar6;
                        } while (uVar55 != uVar63);
                      }
                    }
                    else {
                      pdVar8 = pDVar27->pmf_X;
                      lVar49 = -(ulong)(pdVar8[uVar48] < dVar77);
                      auVar14._8_4_ = (int)lVar49;
                      auVar14._0_8_ = -(ulong)(pdVar8[uVar48] < dVar3);
                      auVar14._12_4_ = (int)((ulong)lVar49 >> 0x20);
                      uVar52 = movmskpd(uVar51,auVar14);
                      uVar64 = (ulong)-(uint)(*pdVar8 <= dVar77);
                      if ((uVar52 & 2) != 0) {
                        uVar64 = uVar48;
                      }
                      uVar46 = (uint)uVar64;
                      uVar55 = -(uint)(*pdVar8 <= dVar3);
                      if ((uVar52 & 1) != 0) {
                        uVar55 = uVar66;
                      }
                      uVar66 = uVar55;
                      if (uVar46 == 0xffffffff) {
                        uVar64 = 0xffffffff;
                        if (uVar48 != 0) {
                          uVar56 = 0;
                          uVar44 = 0xffffffff;
                          do {
                            if ((pdVar8[uVar56] <= dVar77) && (dVar77 <= pdVar8[uVar56 + 1])) {
                              uVar64 = (ulong)((int)uVar56 + 1);
                              uVar44 = uVar56 & 0xffffffff;
                            }
                            uVar46 = (uint)uVar44;
                            uVar56 = uVar56 + 1;
                          } while (uVar48 != uVar56);
                          goto LAB_0027004f;
                        }
                        uVar46 = 0xffffffff;
                      }
                      else {
LAB_0027004f:
                        if (uVar55 == 0xffffffff) {
                          if (uVar48 == 0) {
                            uVar55 = 0xffffffff;
                            uVar66 = 0xffffffff;
                          }
                          else {
                            uVar55 = 0xffffffff;
                            uVar56 = 0;
                            uVar44 = 0xffffffff;
                            do {
                              if ((pdVar8[uVar56] <= dVar3) && (dVar3 <= pdVar8[uVar56 + 1])) {
                                uVar55 = (int)uVar56 + 1;
                                uVar44 = uVar56 & 0xffffffff;
                              }
                              uVar56 = uVar56 + 1;
                              uVar66 = (uint)uVar44;
                            } while (uVar48 != uVar56);
                          }
                        }
                      }
                      uVar52 = pDVar27->m_nVar;
                      if (uVar52 != 0) {
                        dVar78 = pdVar8[(int)uVar46];
                        pRVar9 = pDVar27->pmf_Y;
                        uVar61 = (uint)uVar64;
                        dVar72 = pdVar8[(int)uVar61];
                        uVar63 = 0;
                        do {
                          iVar45 = uVar63 * uVar6;
                          dVar74 = pRVar9[iVar45 + uVar46];
                          dVar79 = 0.0;
                          if (uVar46 != uVar61) {
                            dVar79 = (pRVar9[iVar45 + uVar61] - dVar74) / (dVar72 - dVar78);
                          }
                          dVar76 = dVar79 * (dVar77 - dVar78) + dVar74;
                          iVar35 = (int)uVar64;
                          if (uVar46 == uVar66) {
                            dVar79 = (dVar76 + dVar79 * (dVar3 - dVar78) + dVar74) * 0.5;
                          }
                          else {
                            dVar74 = pRVar9[iVar45 + uVar66];
                            dVar79 = 0.0;
                            if (uVar66 != uVar55) {
                              dVar79 = (pRVar9[iVar45 + uVar55] - dVar74) /
                                       (pdVar8[(int)uVar55] - pdVar8[(int)uVar66]);
                            }
                            dVar73 = dVar3 - pdVar8[(int)uVar66];
                            dVar79 = (dVar79 * dVar73 + dVar74 + dVar74) * dVar73 * 0.5 +
                                     (pRVar9[iVar45 + uVar61] + dVar76) * (dVar72 - dVar77) * 0.5;
                            lVar49 = (long)(int)uVar61;
                            dVar74 = dVar72;
                            if ((int)uVar61 < (int)uVar66) {
                              do {
                                lVar65 = lVar49 + 1;
                                lVar49 = lVar49 + 1;
                                pdVar41 = pRVar9 + uVar64;
                                uVar64 = (ulong)((int)uVar64 + 1);
                                dVar79 = dVar79 + (*pdVar41 + pRVar9[uVar64]) *
                                                  (pdVar8[lVar65] - dVar74) * 0.5;
                                dVar74 = pdVar8[lVar65];
                              } while ((int)uVar66 != lVar49);
                            }
                            dVar79 = dVar79 / (dVar3 - dVar77);
                          }
                          *(double *)(local_558 + (long)(int)uVar63 * 8) = dVar79;
                          uVar63 = uVar63 + 1;
                          uVar64 = (ulong)(iVar35 + uVar6);
                        } while (uVar63 != uVar52);
                      }
                    }
                    lVar65 = (long)iVar36;
                    lVar67 = lVar65 - (pAVar39->begin).x;
                    lVar68 = ((long)iVar62 - (long)(pAVar39->begin).y) * pAVar39->jstride;
                    lVar53 = ((long)(int)local_7b0 - (long)(pAVar39->begin).z) * pAVar39->kstride;
                    lVar49 = pAVar39->nstride;
                    pdVar8 = pAVar39->p;
                    pdVar8[lVar68 + lVar67 + lVar53 + lVar49 * 0x1a] = (double)local_558._0_8_;
                    dVar77 = 1.0 / (dStack_4a8 * 28.014 +
                                    local_4b0 * 30.07 +
                                    local_4b8 * 29.062 +
                                    dStack_4c0 * 28.054 +
                                    local_4c8 * 31.034 +
                                    dStack_4d0 * 30.026 +
                                    local_4d8 * 29.018 +
                                    dStack_4e0 * 44.009 +
                                    local_4e8 * 28.01 +
                                    dStack_4f0 * 16.043 +
                                    local_4f8 * 15.035 +
                                    dStack_500 * 14.027 +
                                    local_508 * 14.027 +
                                    dStack_510 * 33.006 +
                                    local_518 * 18.015 +
                                    dStack_520 * 17.007 +
                                    local_528 * 31.998 +
                                    dStack_530 * 15.999 +
                                    (double)vStack_548.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage *
                                    1.008 + (double)vStack_548.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish * 2.016
                                            + 0.0 + local_4a0 * 39.95);
                    local_768._0_8_ =
                         (_func_int **)
                         ((double)vStack_548.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish * 2.016 * dVar77);
                    local_768._8_8_ =
                         (double)vStack_548.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage * 1.008 * dVar77
                    ;
                    dVar3 = local_528 * 31.998 * dVar77;
                    local_758._8_4_ = SUB84(dVar3,0);
                    local_758._0_8_ = dStack_530 * 15.999 * dVar77;
                    local_758._12_4_ = (int)((ulong)dVar3 >> 0x20);
                    dVar3 = local_518 * 18.015 * dVar77;
                    local_748._8_4_ = SUB84(dVar3,0);
                    local_748._0_8_ = dStack_520 * 17.007 * dVar77;
                    local_748._12_4_ = (int)((ulong)dVar3 >> 0x20);
                    dVar3 = local_508 * 14.027 * dVar77;
                    local_738._8_4_ = SUB84(dVar3,0);
                    local_738._0_8_ = dStack_510 * 33.006 * dVar77;
                    local_738._12_4_ = (int)((ulong)dVar3 >> 0x20);
                    dVar3 = local_4f8 * 15.035 * dVar77;
                    local_728._8_4_ = SUB84(dVar3,0);
                    local_728._0_8_ = dStack_500 * 14.027 * dVar77;
                    local_728._12_4_ = (int)((ulong)dVar3 >> 0x20);
                    local_718 = dStack_4f0 * 16.043 * dVar77;
                    dStack_710 = local_4e8 * 28.01 * dVar77;
                    local_708 = dStack_4e0 * 44.009 * dVar77;
                    dStack_700 = local_4d8 * 29.018 * dVar77;
                    local_6f8 = dStack_4d0 * 30.026 * dVar77;
                    dStack_6f0 = local_4c8 * 31.034 * dVar77;
                    local_6e8 = dStack_4c0 * 28.054 * dVar77;
                    dStack_6e0 = local_4b8 * 29.062 * dVar77;
                    local_6d8 = local_4b0 * 30.07 * dVar77;
                    dStack_6d0 = dStack_4a8 * 28.014 * dVar77;
                    local_6c8 = dVar77 * local_4a0 * 39.95;
                    pdVar8[lVar68 + lVar67 + lVar53] = 0.0;
                    pdVar8[lVar68 + lVar67 + lVar53 + lVar49] = 0.0;
                    pdVar8[lVar68 + lVar67 + lVar53 + lVar49 * 2] = (double)local_558._8_8_ * 0.01;
                    dVar3 = pPVar25->P_mean;
                    dVar77 = pdVar8[lVar68 + lVar67 + lVar53 + lVar49 * 0x1a];
                    local_678._0_8_ = (pointer)0x3fdfbefbefbefbf0;
                    local_678._8_8_ = 0x3fefbefbefbefbf0;
                    local_678._16_8_ = 0x3fb000418a43bf8c;
                    local_678._24_8_ = 0x3fa000418a43bf8c;
                    local_658._0_4_ = -0x48f1ed02;
                    local_658._4_4_ = 0x3fae1af1;
                    vStack_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fac6bb6f569cbd9;
                    vStack_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f9f065042c3dbd3;
                    vStack_650.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fb24021df7a429e
                    ;
                    local_638 = 0.07129108148570615;
                    RStack_630 = 0.06651147322913202;
                    local_628.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x3fafea0b02aa32d7;
                    local_628.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa24778bbe8f7dd;
                    local_628.super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3f9744998b9a1c0d;
                    pGStack_610 = (pointer)0x3fa1a4eba7fd99b3;
                    local_608 = (pointer)0x3fa10d488e47ecc4;
                    pGStack_600 = (pointer)0x3fa07f7f2eefd932;
                    local_5f8 = (pointer)0x3fa24021df7a429e;
                    auStack_5f0._8_8_ = 0x3fa106e55a53f15b;
                    auStack_5f0._0_8_ = 0x3fa19e14f6ff5920;
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fa246cdaf410bdd;
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f99a1cd6070c7ee;
                    lVar57 = 0;
                    do {
                      *(double *)(local_208 + lVar57 * 8) =
                           *(double *)(local_768 + lVar57 * 8) * *(double *)(local_678 + lVar57 * 8)
                      ;
                      lVar57 = lVar57 + 1;
                    } while (lVar57 != 0x15);
                    dVar78 = 0.0;
                    lVar57 = 0;
                    do {
                      dVar78 = dVar78 + *(double *)(local_208 + lVar57 * 8);
                      lVar57 = lVar57 + 1;
                    } while (lVar57 != 0x15);
                    pdVar8[lVar68 + lVar67 + lVar53 + lVar49 * 3] =
                         ((dVar3 * 10.0) / (dVar77 * 83144626.1815324 * dVar78)) * 1000.0;
                    dVar3 = pdVar8[lVar68 + lVar67 + lVar53 + lVar49 * 0x1a];
                    dVar72 = dVar3 * dVar3;
                    dVar78 = dVar3 * dVar72;
                    dVar77 = dVar3 * dVar78;
                    local_208._0_8_ = (_func_int **)0x3fdfbefbefbefbf0;
                    local_208._8_8_ = 0x3fefbefbefbefbf0;
                    local_1f8[0]._M_allocated_capacity = 0x3fb000418a43bf8c;
                    local_1f8[0]._8_8_ = 0x3fa000418a43bf8c;
                    local_1f8[1]._0_8_ = 0x3fae1af1b70e12fe;
                    local_1f8[1]._8_8_ = 0x3fac6bb6f569cbd9;
                    local_1f8[2]._0_8_ = 0x3f9f065042c3dbd3;
                    local_1f8[2]._8_8_ = 0x3fb24021df7a429e;
                    local_1f8[3]._0_8_ = 0x3fb24021df7a429e;
                    local_1f8[3]._8_8_ = 0x3fb106e55a53f15b;
                    local_1b8 = (element_type *)0x3fafea0b02aa32d7;
                    _Stack_1b0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa24778bbe8f7dd;
                    local_1a8 = (element_type *)0x3f9744998b9a1c0d;
                    _Stack_1a0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa1a4eba7fd99b3;
                    local_198 = (element_type *)0x3fa10d488e47ecc4;
                    _Stack_190._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fa07f7f2eefd932;
                    local_188 = (pointer)0x3fa24021df7a429e;
                    piStack_180 = (pointer)0x3fa19e14f6ff5920;
                    local_178 = (pointer)0x3fa106e55a53f15b;
                    p_Stack_170 = (_Bit_type *)0x3fa246cdaf410bdd;
                    local_168._0_4_ = 0x6070c7ee;
                    local_168._4_4_ = 0x3f99a1cd;
                    dVar74 = 1.0 / dVar3;
                    if (1000.0 <= dVar3) {
                      local_678._0_8_ =
                           (pointer)(dVar74 * -950.158922 +
                                    dVar77 * 4.00510752e-15 +
                                    dVar78 * -4.48915985e-11 +
                                    dVar72 * 1.66485593e-07 + dVar3 * -2.47012365e-05 + 3.3372792);
                      local_678._8_8_ =
                           dVar74 * 25473.6599 +
                           dVar77 * 9.96394714e-23 +
                           dVar78 * -1.18378809e-18 +
                           dVar72 * 5.38539827e-15 + dVar3 * -1.15421486e-11 + 2.50000001;
                      local_678._16_8_ =
                           dVar74 * 29217.5791 +
                           dVar77 * 2.45667382e-16 +
                           dVar78 * -2.50444497e-12 +
                           dVar72 * 1.39828196e-08 + dVar3 * -4.29870569e-05 + 2.56942078;
                      local_678._24_8_ =
                           dVar74 * -1088.45772 +
                           dVar77 * -4.33435588e-15 +
                           dVar78 * 5.23676387e-11 +
                           dVar72 * -2.52655556e-07 + dVar3 * 0.00074154377 + 3.28253784;
                      local_658 = dVar74 * 3858.657 +
                                  dVar77 * 2.34824752e-15 +
                                  dVar78 * -2.19865389e-11 +
                                  dVar72 * 4.21684093e-08 + dVar3 * 0.000274214858 + 3.09288767;
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(dVar74 * -30004.2971 +
                                    dVar77 * 3.36401984e-15 +
                                    dVar78 * -2.42604967e-11 +
                                    dVar72 * -5.46908393e-08 + dVar3 * 0.00108845902 + 3.03399249);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(dVar74 * 111.856713 +
                                    dVar77 * -2.1581707e-15 +
                                    dVar78 * 2.85615925e-11 +
                                    dVar72 * -2.11219383e-07 + dVar3 * 0.00111991006 + 4.0172109);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar74 * 46263.604 +
                                    dVar77 * -3.75455134e-15 +
                                    dVar78 * 6.50448872e-11 +
                                    dVar72 * -4.69648657e-07 + dVar3 * 0.00182819646 + 2.87410113);
                      local_638 = dVar74 * 50925.9997 +
                                  dVar77 * -6.7943273e-15 +
                                  dVar78 * 1.044765e-10 +
                                  dVar72 * -6.70639823e-07 + dVar3 * 0.00232794318 + 2.29203842;
                      RStack_630 = dVar74 * 16775.5843 +
                                   dVar77 * -9.34308788e-15 +
                                   dVar78 * 1.48921161e-10 +
                                   dVar72 * -9.95714493e-07 + dVar3 * 0.00361995018 + 2.28571772;
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)(dVar74 * -9468.34459 +
                                    dVar77 * -2.0363046e-14 +
                                    dVar78 * 3.05731338e-10 +
                                    dVar72 * -1.9109527e-06 + dVar3 * 0.00669547335 + 0.074851495);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           (pointer)(dVar74 * -14151.8724 +
                                    dVar77 * -4.07295432e-15 +
                                    dVar78 * 5.7513252e-11 +
                                    dVar72 * -3.32941924e-07 + dVar3 * 0.00103126372 + 2.71518561);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar74 * -48759.166 +
                                    dVar77 * -9.44168328e-15 +
                                    dVar78 * 1.30872547e-10 +
                                    dVar72 * -7.38271347e-07 + dVar3 * 0.00220718513 + 3.85746029);
                      pGStack_610 = (pointer)(dVar74 * 4011.91815 +
                                             dVar77 * -1.06701742e-14 +
                                             dVar78 * 1.47290445e-10 +
                                             dVar72 * -8.28152043e-07 +
                                             dVar3 * 0.00247847763 + 2.77217438);
                      local_608 = (pointer)(dVar74 * -13995.8323 +
                                           dVar77 * -1.76771128e-14 +
                                           dVar78 * 2.5160303e-10 +
                                           dVar72 * -1.47419604e-06 +
                                           dVar3 * 0.00460000041 + 1.76069008);
                      pGStack_600 = (pointer)(dVar74 * 127.83252 +
                                             dVar77 * -4.225232e-15 +
                                             dVar78 * 9.8610775e-11 +
                                             dVar72 * -8.85461333e-07 +
                                             dVar3 * 0.0039357485 + 3.770799);
                      local_5f8 = (pointer)(dVar74 * 4939.88614 +
                                           dVar77 * -2.51412122e-14 +
                                           dVar78 * 3.68057308e-10 +
                                           dVar72 * -2.23692638e-06 +
                                           dVar3 * 0.00732270755 + 2.03611116);
                      dVar79 = dVar74 * 12857.52 +
                               dVar77 * -2.99283152e-14 +
                               dVar78 * 4.38044223e-10 +
                               dVar72 * -2.66068889e-06 + dVar3 * 0.0086986361 + 1.95465642;
                      dVar76 = dVar74 * -11426.3932 +
                               dVar77 * -3.8000578e-14 +
                               dVar78 * 5.53530003e-10 +
                               dVar72 * -3.3418689e-06 + dVar3 * 0.0108426339 + 1.0718815;
                      dVar75 = dVar77 * -1.3506702e-15 +
                               dVar78 * 2.5242595e-11 +
                               dVar72 * -1.89492e-07 + dVar3 * 0.0007439884 + 2.92664;
                      dVar73 = dVar74 * -922.7977;
                    }
                    else {
                      local_678._0_8_ =
                           (pointer)(dVar74 * -917.935173 +
                                    dVar77 * -1.47522352e-12 +
                                    dVar78 * 5.03930235e-09 +
                                    dVar72 * -6.492717e-06 + dVar3 * 0.00399026037 + 2.34433112);
                      local_678._8_8_ =
                           dVar74 * 25473.6599 +
                           dVar77 * -1.85546466e-22 +
                           dVar78 * 5.7520408e-19 +
                           dVar72 * -6.65306547e-16 + dVar3 * 3.52666409e-13 + 2.5;
                      local_678._16_8_ =
                           dVar74 * 29122.2592 +
                           dVar77 * 4.22531942e-13 +
                           dVar78 * -1.53201656e-09 +
                           dVar72 * 2.21435465e-06 + dVar3 * -0.00163965942 + 3.1682671;
                      local_678._24_8_ =
                           dVar74 * -1063.94356 +
                           dVar77 * 6.48745674e-13 +
                           dVar78 * -2.42032377e-09 +
                           dVar72 * 3.282434e-06 + dVar3 * -0.00149836708 + 3.78245636;
                      local_658 = dVar74 * 3615.08056 +
                                  dVar77 * 2.7282294e-13 +
                                  dVar78 * -9.70283332e-10 +
                                  dVar72 * 1.5393128e-06 + dVar3 * -0.00120065876 + 3.99201543;
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(dVar74 * -30293.7267 +
                                    dVar77 * 3.54395634e-13 +
                                    dVar78 * -1.37199266e-09 +
                                    dVar72 * 2.17346737e-06 + dVar3 * -0.00101821705 + 4.19864056);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(dVar74 * 294.80804 +
                                    dVar77 * 1.85845025e-12 +
                                    dVar78 * -6.06909735e-09 +
                                    dVar72 * 7.05276303e-06 + dVar3 * -0.00237456025 + 4.30179801);
                      vStack_650.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar74 * 46004.0401 +
                                    dVar77 * 3.37483438e-13 +
                                    dVar78 * -9.62727883e-10 +
                                    dVar72 * 9.31632803e-07 + dVar3 * 0.000484436072 + 3.76267867);
                      local_638 = dVar74 * 50496.8163 +
                                  dVar77 * 3.88629474e-13 +
                                  dVar78 * -1.67203995e-09 +
                                  dVar72 * 2.74432073e-06 + dVar3 * -0.0011833071 + 4.19860411;
                      RStack_630 = dVar74 * 16444.9988 +
                                   dVar77 * 5.08771468e-13 +
                                   dVar78 * -1.71779356e-09 +
                                   dVar72 * 1.91007285e-06 + dVar3 * 0.00100547588 + 3.6735904;
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start =
                           (pointer)(dVar74 * -10246.6476 +
                                    dVar77 * 3.33387912e-12 +
                                    dVar78 * -1.21185757e-08 +
                                    dVar72 * 1.63933533e-05 + dVar3 * -0.0068354894 + 5.14987613);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           (pointer)(dVar74 * -14344.086 +
                                    dVar77 * -1.808849e-13 +
                                    dVar78 * 2.26751471e-10 +
                                    dVar72 * 3.3893811e-07 + dVar3 * -0.00030517684 + 3.57953347);
                      local_628.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage =
                           (pointer)(dVar74 * -48371.9697 +
                                    dVar77 * -2.87399096e-14 +
                                    dVar78 * 6.14797555e-10 +
                                    dVar72 * -2.3745209e-06 + dVar3 * 0.00449229839 + 2.35677352);
                      pGStack_610 = (pointer)(dVar74 * 3839.56496 +
                                             dVar77 * 8.6753773e-13 +
                                             dVar78 * -3.32860233e-09 +
                                             dVar72 * 4.59331487e-06 +
                                             dVar3 * -0.00162196266 + 4.22118584);
                      local_608 = (pointer)(dVar74 * -14308.9567 +
                                           dVar77 * 2.63545304e-12 +
                                           dVar78 * -9.48213152e-09 +
                                           dVar72 * 1.24406669e-05 +
                                           dVar3 * -0.00495416684 + 4.79372315);
                      pGStack_600 = (pointer)(dVar74 * 978.6011 +
                                             dVar77 * 4.15122e-13 +
                                             dVar78 * -1.844409e-09 +
                                             dVar72 * 1.77949067e-06 +
                                             dVar3 * 0.0036082975 + 2.106204);
                      local_5f8 = (pointer)(dVar74 * 5089.77593 +
                                           dVar77 * 5.39768746e-12 +
                                           dVar78 * -1.72897188e-08 +
                                           dVar72 * 1.90330097e-05 +
                                           dVar3 * -0.00378526124 + 3.95920148);
                      dVar79 = dVar74 * 12841.6265 +
                               dVar77 * 4.61018008e-12 +
                               dVar78 * -1.49781651e-08 +
                               dVar72 * 1.65714269e-05 + dVar3 * -0.00209329446 + 4.30646568;
                      dVar76 = dVar74 * -11522.2055 +
                               dVar77 * 5.37371542e-12 +
                               dVar78 * -1.77116571e-08 +
                               dVar72 * 1.99812763e-05 + dVar3 * -0.00275077135 + 4.29142492;
                      dVar75 = dVar77 * -4.889708e-13 +
                               dVar78 * 1.41037875e-09 +
                               dVar72 * -1.321074e-06 + dVar3 * 0.0007041202 + 3.298677;
                      dVar73 = dVar74 * -1020.8999;
                    }
                    auStack_5f0._8_8_ = dVar76;
                    auStack_5f0._0_8_ = dVar79;
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar73 + dVar75);
                    vStack_5e0.
                    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar74 * -745.375 +
                                  dVar77 * 0.0 + dVar78 * 0.0 + dVar72 * 0.0 + dVar3 * 0.0 + 2.5);
                    lVar57 = 0;
                    do {
                      *(double *)(local_678 + lVar57 * 8) =
                           *(double *)(local_208 + lVar57 * 8) * dVar3 * 83144626.1815324 *
                           *(double *)(local_678 + lVar57 * 8);
                      lVar57 = lVar57 + 1;
                    } while (lVar57 != 0x15);
                    dVar3 = 0.0;
                    lVar57 = 0;
                    do {
                      dVar3 = dVar3 + *(double *)(local_768 + lVar57 * 8) *
                                      *(double *)(local_678 + lVar57 * 8);
                      lVar57 = lVar57 + 1;
                    } while (lVar57 != 0x15);
                    pdVar8[lVar68 + lVar67 + lVar53 + lVar49 * 0x19] = dVar3;
                    lVar68 = (long)(pAVar39->begin).x;
                    lVar67 = lVar65 - lVar68;
                    pdVar8 = pAVar39->p;
                    lVar49 = pAVar39->nstride;
                    lVar53 = ((long)iVar62 - (long)(pAVar39->begin).y) * pAVar39->jstride;
                    lVar57 = ((long)(int)local_7b0 - (long)(pAVar39->begin).z) * pAVar39->kstride;
                    pdVar8[lVar53 + lVar67 + lVar57 + lVar49 * 0x19] =
                         pdVar8[lVar53 + lVar67 + lVar57 + lVar49 * 0x19] * 0.0001 *
                         pdVar8[lVar53 + lVar67 + lVar57 + lVar49 * 3];
                    pdVar41 = pdVar8 + ((lVar57 + lVar53 + lVar65 + lVar49 * 4) - lVar68);
                    lVar65 = 0;
                    do {
                      *pdVar41 = *(double *)(local_768 + lVar65 * 8) *
                                 pdVar8[lVar53 + lVar67 + lVar57 + lVar49 * 3];
                      lVar65 = lVar65 + 1;
                      pdVar41 = pdVar41 + lVar49;
                    } while (lVar65 != 0x15);
                    bVar70 = iVar36 != uVar20;
                    iVar36 = iVar36 + 1;
                  } while (bVar70);
                }
                bVar70 = iVar62 != uVar33;
                iVar62 = iVar62 + 1;
              } while (bVar70);
            }
            bVar70 = (int)local_7b0 != iVar34;
            local_7b0 = (ulong)((int)local_7b0 + 1);
          } while (bVar70);
        }
        amrex::MFIter::operator++((MFIter *)local_2d8);
      } while (local_2b8[0] < local_2b0);
    }
    amrex::MFIter::~MFIter((MFIter *)local_2d8);
  }
  else {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_00.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)this_01.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)this_01.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
    local_698._M_string_length = 0;
    local_698.field_2._M_local_buf[0] = '\0';
    amrex::ParmParse::query(&local_88,"initDataPlt",&local_698,0);
    if (NavierStokesBase::verbose != 0) {
      local_558._8_8_ = amrex::OutStream();
      local_558._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_558._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_548);
      *(undefined8 *)
       ((long)&vStack_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       *(size_type *)
        ((long)vStack_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_558._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_548,"initData: reading data from: ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_548,local_698._M_dataplus._M_p,local_698._M_string_length);
      local_208[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_548,local_208,1);
      amrex::Print::~Print((Print *)local_558);
    }
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,local_698._M_dataplus._M_p,
               local_698._M_dataplus._M_p + local_698._M_string_length);
    pele::physics::pltfilemanager::PltFileManager::PltFileManager
              ((PltFileManager *)local_678,&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_6b8,&vStack_650);
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_228.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
              ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_228);
    if (local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ||
        (long)local_6b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_6b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start < 0) {
      iVar34 = -1;
      lVar49 = -1;
      uVar66 = 0;
      local_848 = -1;
    }
    else {
      lVar49 = 0;
      local_848 = -1;
      lVar65 = 0;
      iVar62 = -1;
      uVar66 = 0;
      iVar36 = -1;
      do {
        std::__cxx11::string::substr
                  ((ulong)local_558,
                   (long)&((local_6b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar49);
        iVar34 = std::__cxx11::string::compare
                           ((char *)((long)&((local_6b8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar49));
        iVar45 = (int)lVar65;
        if (iVar34 == 0) {
          local_848 = iVar45;
        }
        iVar35 = std::__cxx11::string::compare
                           ((char *)((long)&((local_6b8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar49));
        iVar34 = iVar45;
        if (iVar35 != 0) {
          iVar34 = iVar36;
        }
        iVar36 = std::__cxx11::string::compare(local_558);
        uVar66 = uVar66 + (iVar36 == 0);
        iVar36 = std::__cxx11::string::compare(local_558);
        if (-1 < iVar62) {
          iVar45 = iVar62;
        }
        if (iVar36 == 0) {
          iVar62 = iVar45;
        }
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558._0_8_ != &vStack_548) {
          operator_delete((void *)local_558._0_8_,
                          (ulong)((long)vStack_548.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        lVar65 = lVar65 + 1;
        lVar49 = lVar49 + 0x20;
        iVar36 = iVar34;
      } while (lVar65 < (long)local_6b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_6b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
      lVar49 = (long)iVar62;
    }
    a_level_geom = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
               a_level_geom,iVar34,0,3,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
               a_level_geom,local_848,NavierStokesBase::Temp,1,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
    local_558._0_8_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1;
    local_558._8_8_ = (Arena *)0x0;
    vStack_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_548.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_768._0_8_ = &PTR__FabFactory_0080b918;
    amrex::MultiFab::MultiFab
              ((MultiFab *)local_208,&(this->super_NavierStokesBase).super_AmrLevel.grids,
               &(this->super_NavierStokesBase).super_AmrLevel.dmap,uVar66,0,(MFInfo *)local_558,
               (FabFactory<amrex::FArrayBox> *)local_768);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_548);
    pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
              ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
               a_level_geom,iVar34 + 3,0,uVar66,(MultiFab *)local_208);
    lVar65 = 0;
    do {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                     "Y(",spec_names_abi_cxx11_.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar65);
      plVar40 = (long *)std::__cxx11::string::append((char *)local_768);
      pvVar42 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(plVar40 + 2);
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)*plVar40 == pvVar42) {
        vStack_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar42->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        vStack_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar40[3];
        local_558._0_8_ = &vStack_548;
      }
      else {
        vStack_548.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar42->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_558._0_8_ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)*plVar40;
      }
      local_558._8_8_ = plVar40[1];
      *plVar40 = (long)pvVar42;
      plVar40[1] = 0;
      *(undefined1 *)(plVar40 + 2) = 0;
      if ((undefined1 *)local_768._0_8_ != local_758) {
        operator_delete((void *)local_768._0_8_,local_758._0_8_ + 1);
      }
      if ((int)uVar66 < 1) {
LAB_0027169d:
        local_768._0_8_ = (_func_int **)0x0;
        local_768._8_8_ = local_768._8_8_ & 0xffffffff00000000;
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,(int)lVar65 + 4,
                   1,(IntVect *)local_768);
      }
      else {
        bVar70 = true;
        lVar67 = 0;
        do {
          __n = local_558._8_8_;
          __s1 = local_558._0_8_;
          plVar40 = (long *)((long)&local_6b8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar67]._M_dataplus.
                                    _M_p + (lVar49 << 5 | 8U));
          lVar68 = 0;
          while (((Arena *)__n != (Arena *)*plVar40 ||
                 (((Arena *)__n != (Arena *)0x0 &&
                  (iVar34 = bcmp((void *)__s1,(void *)plVar40[-1],__n), iVar34 != 0))))) {
            lVar68 = lVar68 + -1;
            plVar40 = plVar40 + 4;
            if (-(ulong)uVar66 + lVar67 == lVar68) {
              if (!bVar70) goto LAB_002716cc;
              goto LAB_0027169d;
            }
          }
          amrex::MultiFab::Copy
                    ((MultiFab *)
                     this_00.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     (MultiFab *)local_208,(int)lVar67 - (int)lVar68,(int)lVar65 + 4,1,0);
          lVar53 = -(ulong)uVar66 + lVar67;
          lVar67 = (lVar67 + 1) - lVar68;
          bVar70 = false;
        } while (lVar53 + 1 != lVar68);
      }
LAB_002716cc:
      if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_558._0_8_ != &vStack_548) {
        operator_delete((void *)local_558._0_8_,
                        (ulong)((long)vStack_548.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      lVar65 = lVar65 + 1;
    } while (lVar65 != 0x15);
    if (NavierStokesBase::verbose != 0) {
      local_558._8_8_ = amrex::OutStream();
      local_558._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_558._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_548);
      *(undefined8 *)
       ((long)&vStack_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       *(size_type *)
        ((long)vStack_548.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
           *(undefined8 *)
            ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
            (long)(*(_func_int ***)local_558._8_8_)[-3]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&vStack_548,"initData: finished init from pltfile",0x24);
      local_768[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_548,local_768,1);
      amrex::Print::~Print((Print *)local_558);
    }
    amrex::MFIter::MFIter
              ((MFIter *)local_338,
               (FabArrayBase *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    if (local_318 < local_310) {
      do {
        amrex::MFIter::tilebox(&local_574,(MFIter *)local_338);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_388,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MFIter *)local_338)
        ;
        iVar32 = local_388.begin.z;
        iVar31 = local_388.begin.y;
        iVar30 = local_388.begin.x;
        LVar29 = local_388.nstride;
        LVar28 = local_388.kstride;
        pdVar8 = local_388.p;
        iVar35 = local_574.bigend.vect[2];
        iVar45 = local_574.bigend.vect[1];
        iVar36 = local_574.bigend.vect[0];
        iVar62 = local_574.smallend.vect[1];
        iVar34 = local_574.smallend.vect[0];
        pPVar25 = prob_parm_d;
        if (local_574.smallend.vect[2] <= local_574.bigend.vect[2]) {
          lVar67 = CONCAT44(local_388.jstride._4_4_,(undefined4)local_388.jstride);
          lVar68 = (long)local_388.begin.x;
          lVar57 = (long)local_388.begin.y;
          lVar58 = (long)local_388.begin.z;
          lVar59 = local_388.nstride * 0xd0;
          lVar60 = local_388.nstride * 200;
          lVar53 = local_388.nstride * 0x20;
          lVar65 = local_388.nstride * 0x18;
          lVar49 = local_388.kstride * 8;
          iVar22 = local_574.smallend.vect[2];
          do {
            if (iVar62 <= iVar45) {
              local_5a8._0_8_ = pdVar8 + (iVar22 - iVar32) * LVar28;
              iVar23 = iVar62;
              do {
                if (iVar34 <= iVar36) {
                  lVar24 = (iVar23 - lVar57) * lVar67 * 8 +
                           (iVar22 - lVar58) * lVar49 + lVar53 + lVar68 * -8;
                  lVar1 = local_5a8._0_8_ + (iVar23 - iVar31) * lVar67 * 8;
                  iVar47 = iVar34;
                  do {
                    pdVar41 = (double *)((long)pdVar8 + (long)iVar47 * 8 + lVar24);
                    puVar69 = (undefined8 *)((long)pdVar8 + (long)iVar47 * 8 + lVar24);
                    memset(local_2d8,0,0xa8);
                    lVar2 = lVar1 + (long)(iVar47 - iVar30) * 8;
                    lVar43 = 0;
                    do {
                      *(undefined8 *)(local_2d8 + (lVar43 * 2 + -4) * 4 + 0x10) = *puVar69;
                      lVar43 = lVar43 + 1;
                      puVar69 = puVar69 + LVar29;
                    } while (lVar43 != 0x15);
                    dVar4 = pPVar25->P_mean;
                    dVar5 = *(double *)(lVar2 + lVar59);
                    local_768._0_8_ = (_func_int **)0x3fdfbefbefbefbf0;
                    local_768._8_8_ = 0x3fefbefbefbefbf0;
                    local_758._8_8_ = 0x3fa000418a43bf8c;
                    local_758._0_8_ = 0x3fb000418a43bf8c;
                    local_748._8_8_ = 0x3fac6bb6f569cbd9;
                    local_748._0_8_ = 0x3fae1af1b70e12fe;
                    local_738._8_8_ = 0x3fb24021df7a429e;
                    local_738._0_8_ = 0x3f9f065042c3dbd3;
                    local_728._8_8_ = 0x3fb106e55a53f15b;
                    local_728._0_8_ = 0x3fb24021df7a429e;
                    local_718 = 0.06233248145608677;
                    dStack_710 = 0.035701535166012134;
                    local_708 = 0.022722624917630486;
                    dStack_700 = 0.03446136880556896;
                    local_6f8 = 0.033304469459801506;
                    dStack_6f0 = 0.032222723464587225;
                    local_6e8 = 0.035645540742853074;
                    dStack_6e0 = 0.034409194136673316;
                    local_6d8 = 0.03325573661456601;
                    dStack_6d0 = 0.03569643749553795;
                    local_6c8 = 0.025031289111389236;
                    lVar43 = 0;
                    do {
                      *(double *)(local_558 + lVar43 * 8) =
                           *(double *)(local_2d8 + (lVar43 * 2 + -4) * 4 + 0x10) *
                           *(double *)(local_768 + lVar43 * 8);
                      lVar43 = lVar43 + 1;
                    } while (lVar43 != 0x15);
                    dVar15 = 0.0;
                    lVar43 = 0;
                    do {
                      dVar15 = dVar15 + *(double *)(local_558 + lVar43 * 8);
                      lVar43 = lVar43 + 1;
                    } while (lVar43 != 0x15);
                    *(double *)(lVar2 + lVar65) =
                         ((dVar4 * 10.0) / (dVar5 * 83144626.1815324 * dVar15)) * 1000.0;
                    dVar4 = *(double *)(lVar2 + lVar59);
                    dVar16 = dVar4 * dVar4;
                    dVar15 = dVar4 * dVar16;
                    dVar5 = dVar4 * dVar15;
                    local_558._0_8_ =
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)0x3fdfbefbefbefbf0;
                    local_558._8_8_ = (Arena *)0x3fefbefbefbefbf0;
                    vStack_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb000418a43bf8c;
                    vStack_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
                    vStack_548.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fae1af1b70e12fe
                    ;
                    dStack_530 = 0.055509297807382736;
                    local_528 = 0.030297521662727988;
                    dStack_520 = 0.07129108148570615;
                    local_518 = 0.07129108148570615;
                    dStack_510 = 0.06651147322913202;
                    local_508 = 0.06233248145608677;
                    dStack_500 = 0.035701535166012134;
                    local_4f8 = 0.022722624917630486;
                    dStack_4f0 = 0.03446136880556896;
                    local_4e8 = 0.033304469459801506;
                    dStack_4e0 = 0.032222723464587225;
                    local_4d8 = 0.035645540742853074;
                    dStack_4d0 = 0.034409194136673316;
                    local_4c8 = 0.03325573661456601;
                    dStack_4c0 = 0.03569643749553795;
                    local_4b8 = 0.025031289111389236;
                    dVar17 = 1.0 / dVar4;
                    if (1000.0 <= dVar4) {
                      local_768._0_8_ =
                           (_func_int **)
                           (dVar17 * -950.158922 +
                           dVar5 * 4.00510752e-15 +
                           dVar15 * -4.48915985e-11 +
                           dVar16 * 1.66485593e-07 + dVar4 * -2.47012365e-05 + 3.3372792);
                      local_768._8_8_ =
                           dVar17 * 25473.6599 +
                           dVar5 * 9.96394714e-23 +
                           dVar15 * -1.18378809e-18 +
                           dVar16 * 5.38539827e-15 + dVar4 * -1.15421486e-11 + 2.50000001;
                      local_758._8_8_ =
                           dVar17 * -1088.45772 +
                           dVar5 * -4.33435588e-15 +
                           dVar15 * 5.23676387e-11 +
                           dVar16 * -2.52655556e-07 + dVar4 * 0.00074154377 + 3.28253784;
                      local_758._0_8_ =
                           dVar17 * 29217.5791 +
                           dVar5 * 2.45667382e-16 +
                           dVar15 * -2.50444497e-12 +
                           dVar16 * 1.39828196e-08 + dVar4 * -4.29870569e-05 + 2.56942078;
                      local_748._8_8_ =
                           dVar17 * -30004.2971 +
                           dVar5 * 3.36401984e-15 +
                           dVar15 * -2.42604967e-11 +
                           dVar16 * -5.46908393e-08 + dVar4 * 0.00108845902 + 3.03399249;
                      local_748._0_8_ =
                           dVar17 * 3858.657 +
                           dVar5 * 2.34824752e-15 +
                           dVar15 * -2.19865389e-11 +
                           dVar16 * 4.21684093e-08 + dVar4 * 0.000274214858 + 3.09288767;
                      local_738._8_8_ =
                           dVar17 * 46263.604 +
                           dVar5 * -3.75455134e-15 +
                           dVar15 * 6.50448872e-11 +
                           dVar16 * -4.69648657e-07 + dVar4 * 0.00182819646 + 2.87410113;
                      local_738._0_8_ =
                           dVar17 * 111.856713 +
                           dVar5 * -2.1581707e-15 +
                           dVar15 * 2.85615925e-11 +
                           dVar16 * -2.11219383e-07 + dVar4 * 0.00111991006 + 4.0172109;
                      local_728._8_8_ =
                           dVar17 * 16775.5843 +
                           dVar5 * -9.34308788e-15 +
                           dVar15 * 1.48921161e-10 +
                           dVar16 * -9.95714493e-07 + dVar4 * 0.00361995018 + 2.28571772;
                      local_728._0_8_ =
                           dVar17 * 50925.9997 +
                           dVar5 * -6.7943273e-15 +
                           dVar15 * 1.044765e-10 +
                           dVar16 * -6.70639823e-07 + dVar4 * 0.00232794318 + 2.29203842;
                      local_718 = dVar17 * -9468.34459 +
                                  dVar5 * -2.0363046e-14 +
                                  dVar15 * 3.05731338e-10 +
                                  dVar16 * -1.9109527e-06 + dVar4 * 0.00669547335 + 0.074851495;
                      dStack_710 = dVar17 * -14151.8724 +
                                   dVar5 * -4.07295432e-15 +
                                   dVar15 * 5.7513252e-11 +
                                   dVar16 * -3.32941924e-07 + dVar4 * 0.00103126372 + 2.71518561;
                      local_708 = dVar17 * -48759.166 +
                                  dVar5 * -9.44168328e-15 +
                                  dVar15 * 1.30872547e-10 +
                                  dVar16 * -7.38271347e-07 + dVar4 * 0.00220718513 + 3.85746029;
                      dStack_700 = dVar17 * 4011.91815 +
                                   dVar5 * -1.06701742e-14 +
                                   dVar15 * 1.47290445e-10 +
                                   dVar16 * -8.28152043e-07 + dVar4 * 0.00247847763 + 2.77217438;
                      local_6f8 = dVar17 * -13995.8323 +
                                  dVar5 * -1.76771128e-14 +
                                  dVar15 * 2.5160303e-10 +
                                  dVar16 * -1.47419604e-06 + dVar4 * 0.00460000041 + 1.76069008;
                      dStack_6f0 = dVar17 * 127.83252 +
                                   dVar5 * -4.225232e-15 +
                                   dVar15 * 9.8610775e-11 +
                                   dVar16 * -8.85461333e-07 + dVar4 * 0.0039357485 + 3.770799;
                      local_6e8 = dVar17 * 4939.88614 +
                                  dVar5 * -2.51412122e-14 +
                                  dVar15 * 3.68057308e-10 +
                                  dVar16 * -2.23692638e-06 + dVar4 * 0.00732270755 + 2.03611116;
                      dStack_6e0 = dVar17 * 12857.52 +
                                   dVar5 * -2.99283152e-14 +
                                   dVar15 * 4.38044223e-10 +
                                   dVar16 * -2.66068889e-06 + dVar4 * 0.0086986361 + 1.95465642;
                      dVar77 = dVar5 * -3.8000578e-14 +
                               dVar15 * 5.53530003e-10 +
                               dVar16 * -3.3418689e-06 + dVar4 * 0.0108426339 + 1.0718815;
                      dVar78 = dVar5 * -1.3506702e-15 +
                               dVar15 * 2.5242595e-11 +
                               dVar16 * -1.89492e-07 + dVar4 * 0.0007439884 + 2.92664;
                      dVar13 = -11426.3932;
                      dVar3 = -922.7977;
                    }
                    else {
                      local_768._0_8_ =
                           (_func_int **)
                           (dVar17 * -917.935173 +
                           dVar5 * -1.47522352e-12 +
                           dVar15 * 5.03930235e-09 +
                           dVar16 * -6.492717e-06 + dVar4 * 0.00399026037 + 2.34433112);
                      local_768._8_8_ =
                           dVar17 * 25473.6599 +
                           dVar5 * -1.85546466e-22 +
                           dVar15 * 5.7520408e-19 +
                           dVar16 * -6.65306547e-16 + dVar4 * 3.52666409e-13 + 2.5;
                      local_758._8_8_ =
                           dVar17 * -1063.94356 +
                           dVar5 * 6.48745674e-13 +
                           dVar15 * -2.42032377e-09 +
                           dVar16 * 3.282434e-06 + dVar4 * -0.00149836708 + 3.78245636;
                      local_758._0_8_ =
                           dVar17 * 29122.2592 +
                           dVar5 * 4.22531942e-13 +
                           dVar15 * -1.53201656e-09 +
                           dVar16 * 2.21435465e-06 + dVar4 * -0.00163965942 + 3.1682671;
                      local_748._8_8_ =
                           dVar17 * -30293.7267 +
                           dVar5 * 3.54395634e-13 +
                           dVar15 * -1.37199266e-09 +
                           dVar16 * 2.17346737e-06 + dVar4 * -0.00101821705 + 4.19864056;
                      local_748._0_8_ =
                           dVar17 * 3615.08056 +
                           dVar5 * 2.7282294e-13 +
                           dVar15 * -9.70283332e-10 +
                           dVar16 * 1.5393128e-06 + dVar4 * -0.00120065876 + 3.99201543;
                      local_738._8_8_ =
                           dVar17 * 46004.0401 +
                           dVar5 * 3.37483438e-13 +
                           dVar15 * -9.62727883e-10 +
                           dVar16 * 9.31632803e-07 + dVar4 * 0.000484436072 + 3.76267867;
                      local_738._0_8_ =
                           dVar17 * 294.80804 +
                           dVar5 * 1.85845025e-12 +
                           dVar15 * -6.06909735e-09 +
                           dVar16 * 7.05276303e-06 + dVar4 * -0.00237456025 + 4.30179801;
                      local_728._8_8_ =
                           dVar17 * 16444.9988 +
                           dVar5 * 5.08771468e-13 +
                           dVar15 * -1.71779356e-09 +
                           dVar16 * 1.91007285e-06 + dVar4 * 0.00100547588 + 3.6735904;
                      local_728._0_8_ =
                           dVar17 * 50496.8163 +
                           dVar5 * 3.88629474e-13 +
                           dVar15 * -1.67203995e-09 +
                           dVar16 * 2.74432073e-06 + dVar4 * -0.0011833071 + 4.19860411;
                      local_718 = dVar17 * -10246.6476 +
                                  dVar5 * 3.33387912e-12 +
                                  dVar15 * -1.21185757e-08 +
                                  dVar16 * 1.63933533e-05 + dVar4 * -0.0068354894 + 5.14987613;
                      dStack_710 = dVar17 * -14344.086 +
                                   dVar5 * -1.808849e-13 +
                                   dVar15 * 2.26751471e-10 +
                                   dVar16 * 3.3893811e-07 + dVar4 * -0.00030517684 + 3.57953347;
                      local_708 = dVar17 * -48371.9697 +
                                  dVar5 * -2.87399096e-14 +
                                  dVar15 * 6.14797555e-10 +
                                  dVar16 * -2.3745209e-06 + dVar4 * 0.00449229839 + 2.35677352;
                      dStack_700 = dVar17 * 3839.56496 +
                                   dVar5 * 8.6753773e-13 +
                                   dVar15 * -3.32860233e-09 +
                                   dVar16 * 4.59331487e-06 + dVar4 * -0.00162196266 + 4.22118584;
                      local_6f8 = dVar17 * -14308.9567 +
                                  dVar5 * 2.63545304e-12 +
                                  dVar15 * -9.48213152e-09 +
                                  dVar16 * 1.24406669e-05 + dVar4 * -0.00495416684 + 4.79372315;
                      dStack_6f0 = dVar17 * 978.6011 +
                                   dVar5 * 4.15122e-13 +
                                   dVar15 * -1.844409e-09 +
                                   dVar16 * 1.77949067e-06 + dVar4 * 0.0036082975 + 2.106204;
                      local_6e8 = dVar17 * 5089.77593 +
                                  dVar5 * 5.39768746e-12 +
                                  dVar15 * -1.72897188e-08 +
                                  dVar16 * 1.90330097e-05 + dVar4 * -0.00378526124 + 3.95920148;
                      dStack_6e0 = dVar17 * 12841.6265 +
                                   dVar5 * 4.61018008e-12 +
                                   dVar15 * -1.49781651e-08 +
                                   dVar16 * 1.65714269e-05 + dVar4 * -0.00209329446 + 4.30646568;
                      dVar77 = dVar5 * 5.37371542e-12 +
                               dVar15 * -1.77116571e-08 +
                               dVar16 * 1.99812763e-05 + dVar4 * -0.00275077135 + 4.29142492;
                      dVar78 = dVar5 * -4.889708e-13 +
                               dVar15 * 1.41037875e-09 +
                               dVar16 * -1.321074e-06 + dVar4 * 0.0007041202 + 3.298677;
                      dVar13 = -11522.2055;
                      dVar3 = -1020.8999;
                    }
                    local_6d8 = dVar17 * dVar13 + dVar77;
                    dStack_6d0 = dVar17 * dVar3 + dVar78;
                    local_6c8 = dVar17 * -745.375 +
                                dVar5 * 0.0 + dVar15 * 0.0 + dVar16 * 0.0 + dVar4 * 0.0 + 2.5;
                    lVar43 = 0;
                    do {
                      *(double *)(local_768 + lVar43 * 8) =
                           *(double *)(local_558 + lVar43 * 8) * dVar4 * 83144626.1815324 *
                           *(double *)(local_768 + lVar43 * 8);
                      lVar43 = lVar43 + 1;
                    } while (lVar43 != 0x15);
                    dVar4 = 0.0;
                    lVar43 = 0;
                    do {
                      dVar4 = dVar4 + *(double *)(local_2d8 + (lVar43 * 2 + -4) * 4 + 0x10) *
                                      *(double *)(local_768 + lVar43 * 8);
                      lVar43 = lVar43 + 1;
                    } while (lVar43 != 0x15);
                    *(double *)(lVar2 + lVar60) = dVar4;
                    *(double *)(lVar2 + lVar60) = dVar4 * 0.0001 * *(double *)(lVar2 + lVar65);
                    lVar43 = 0;
                    do {
                      *pdVar41 = *(double *)(local_2d8 + (lVar43 * 2 + -4) * 4 + 0x10) *
                                 *(double *)(lVar2 + lVar65);
                      lVar43 = lVar43 + 1;
                      pdVar41 = pdVar41 + LVar29;
                    } while (lVar43 != 0x15);
                    bVar70 = iVar47 != iVar36;
                    iVar47 = iVar47 + 1;
                  } while (bVar70);
                }
                bVar70 = iVar23 != iVar45;
                iVar23 = iVar23 + 1;
              } while (bVar70);
            }
            bVar70 = iVar22 != iVar35;
            iVar22 = iVar22 + 1;
          } while (bVar70);
        }
        amrex::MFIter::operator++((MFIter *)local_338);
      } while (local_318 < local_310);
    }
    amrex::MFIter::~MFIter((MFIter *)local_338);
    amrex::MultiFab::~MultiFab((MultiFab *)local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6b8);
    std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_5c8);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&vStack_5e0);
    if (local_5f8 != (pointer)0x0) {
      operator_delete(local_5f8,auStack_5f0._8_8_ - (long)local_5f8);
    }
    if (pGStack_610 != (pointer)0x0) {
      operator_delete(pGStack_610,(long)pGStack_600 - (long)pGStack_610);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_628);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_650);
    if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
      operator_delete((void *)local_678._0_8_,local_678._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,
                      CONCAT71(local_698.field_2._M_allocated_capacity._1_7_,
                               local_698.field_2._M_local_buf[0]) + 1);
    }
  }
  local_558._0_8_ = &vStack_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"1D","");
  local_208._0_8_ = local_208 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"1D_S","");
  showMFsub((string *)local_558,
            (MultiFab *)
            this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
            _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
            super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&stripBox,
            (string *)local_208,(this->super_NavierStokesBase).super_AmrLevel.level,-1);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_1f8[0]._M_allocated_capacity + 1);
  }
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_558._0_8_ != &vStack_548) {
    operator_delete((void *)local_558._0_8_,
                    (ulong)((long)vStack_548.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  pSVar7 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar37 = amrex::StateDescriptor::timeType(pSVar7[1].desc);
  if (TVar37 == Point) {
    RVar12 = pSVar7[1].new_time.stop;
  }
  else {
    RVar12 = (pSVar7[1].new_time.start + pSVar7[1].new_time.stop) * 0.5;
  }
  NavierStokesBase::computeGradP(&this->super_NavierStokesBase,RVar12);
  local_768._0_8_ = local_758;
  local_768._8_8_ = 0;
  auVar21[0xf] = 0;
  auVar21._0_15_ = local_758._1_15_;
  local_758 = auVar21 << 8;
  amrex::ParmParse::query(&local_88,"initVelocityPlt",(string *)local_768,0);
  if (local_768._8_8_ == 0) goto LAB_00272c02;
  if (NavierStokesBase::verbose != 0) {
    local_558._8_8_ = amrex::OutStream();
    local_558._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_558._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_548);
    *(undefined8 *)
     ((long)&vStack_548.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     *(size_type *)
      ((long)vStack_548.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
         *(undefined8 *)
          ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
          (long)(*(_func_int ***)local_558._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&vStack_548,"initData: reading velocity from: ",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&vStack_548,(char *)local_768._0_8_,local_768._8_8_);
    local_208[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_548,local_208,1);
    amrex::Print::~Print((Print *)local_558);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,local_768._0_8_,(char *)(local_768._0_8_ + local_768._8_8_));
  pele::physics::pltfilemanager::PltFileManager::PltFileManager
            ((PltFileManager *)local_678,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2d8,&vStack_650);
  local_338._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_338._8_8_ = (FabArrayBase *)0x0;
  stack0xfffffffffffffcd8 = (pointer)0x0;
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
            ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_338);
  if (local_2d8._8_8_ == local_2d8._0_8_ || (long)(local_2d8._8_8_ - local_2d8._0_8_) < 0) {
LAB_002729ea:
    iVar34 = -1;
    amrex::Abort_host("Could not find velocity fields in supplied peleLM.initVelocityPlt");
  }
  else {
    uVar48 = 0xffffffff;
    lVar49 = 0;
    uVar64 = 0;
    do {
      iVar34 = std::__cxx11::string::compare((char *)(local_2d8._0_8_ + lVar49));
      if (iVar34 == 0) {
        uVar48 = uVar64 & 0xffffffff;
      }
      iVar34 = (int)uVar48;
      uVar64 = uVar64 + 1;
      lVar49 = lVar49 + 0x20;
    } while ((long)uVar64 < (long)(local_2d8._8_8_ - local_2d8._0_8_) >> 5);
    if (iVar34 == -1) goto LAB_002729ea;
  }
  local_558._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x1;
  local_558._8_8_ = (Arena *)0x0;
  vStack_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_548.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388.p = (double *)&PTR__FabFactory_0080b918;
  amrex::MultiFab::MultiFab
            ((MultiFab *)local_208,
             (BoxArray *)
             ((long)this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8),
             (DistributionMapping *)
             ((long)this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0x70),1,0,
             (MFInfo *)local_558,(FabFactory<amrex::FArrayBox> *)&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_548);
  pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
            ((PltFileManager *)local_678,(this->super_NavierStokesBase).super_AmrLevel.level,
             &(this->super_NavierStokesBase).super_AmrLevel.geom,iVar34,0,3,(MultiFab *)local_208);
  amrex::MultiFab::Add
            ((MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,(MultiFab *)local_208,0,0,
             3,0);
  if (NavierStokesBase::verbose != 0) {
    local_558._8_8_ = amrex::OutStream();
    local_558._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_558._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&vStack_548);
    *(undefined8 *)
     ((long)&vStack_548.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     *(size_type *)
      ((long)vStack_548.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
         *(undefined8 *)
          ((long)&((ArenaInfo *)(local_558._8_8_ + 8))->release_threshold +
          (long)(*(_func_int ***)local_558._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&vStack_548,"initData: finished init from peleLM.initVelocityPlt",0x33);
    local_388.p = (double *)CONCAT71(local_388.p._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vStack_548,(char *)&local_388,1);
    amrex::Print::~Print((Print *)local_558);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2d8);
  std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::~vector(&local_5c8);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
            (&vStack_5e0);
  if (local_5f8 != (pointer)0x0) {
    operator_delete(local_5f8,auStack_5f0._8_8_ - (long)local_5f8);
  }
  if (pGStack_610 != (pointer)0x0) {
    operator_delete(pGStack_610,(long)pGStack_600 - (long)pGStack_610);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_628);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_650);
  if ((undefined1 *)local_678._0_8_ != local_678 + 0x10) {
    operator_delete((void *)local_678._0_8_,local_678._16_8_ + 1);
  }
LAB_00272c02:
  NavierStokesBase::make_rho_prev_time(&this->super_NavierStokesBase);
  NavierStokesBase::make_rho_curr_time(&this->super_NavierStokesBase);
  initDataOtherTypes(this);
  NavierStokesBase::set_body_state
            (&this->super_NavierStokesBase,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  set_typical_values(this,false);
  init_mixture_fraction();
  initActiveControl(this);
  NavierStokesBase::InitialRedistribution(&this->super_NavierStokesBase);
  NavierStokesBase::set_body_state
            (&this->super_NavierStokesBase,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  if (NavierStokesBase::have_divu != 0) {
    lVar49 = (long)NavierStokesBase::Divu_Type;
    pSVar7 = (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar37 = amrex::StateDescriptor::timeType(pSVar7[lVar49].desc);
    if (TVar37 == Point) {
      RVar12 = pSVar7[lVar49].new_time.stop;
    }
    else {
      RVar12 = (pSVar7[lVar49].new_time.start + pSVar7[lVar49].new_time.stop) * 0.5;
    }
    this_02 = (this->super_NavierStokesBase).super_AmrLevel.state.
              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar10 = this_02[NavierStokesBase::Divu_Type].new_data._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    amrex::StateData::setTimeLevel(this_02,RVar12,1.0,1.0);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)this,
               (MultiFab *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               ((IntVect *)
               ((long)this_00.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect
               [0],RVar12,0,3,NavierStokesBase::NUM_STATE + -4,3);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2f])(SUB84(RVar12,0),this);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x2d])
              (SUB84(RVar12,0),0,this,pMVar10);
  }
  pBVar50 = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  pBVar54 = &(this->super_NavierStokesBase).old_intersect_new;
  for (lVar49 = 9; lVar49 != 0; lVar49 = lVar49 + -1) {
    *(undefined8 *)&pBVar54->m_bat = *(undefined8 *)&pBVar50->m_bat;
    pBVar50 = (BoxArray *)((long)pBVar50 + (ulong)bVar71 * -0x10 + 8);
    pBVar54 = (BoxArray *)((long)pBVar54 + (ulong)bVar71 * -0x10 + 8);
  }
  (this->super_NavierStokesBase).old_intersect_new.m_ref.
  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_NavierStokesBase).old_intersect_new.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_NavierStokesBase).old_intersect_new.m_simplified_list.
  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_NavierStokesBase).super_AmrLevel.grids.m_simplified_list.
       super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_NavierStokesBase).old_intersect_new.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_NavierStokesBase).super_AmrLevel.grids.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((undefined1 *)local_768._0_8_ != local_758) {
    operator_delete((void *)local_768._0_8_,local_758._0_8_ + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  return;
}

Assistant:

void
PeleLM::initData ()
{
  //
  // Copy problem parameters into device copy
  //
  Gpu::copy(Gpu::hostToDevice, prob_parm, prob_parm+1,
            prob_parm_d);

  //
  // Initialize the state and the pressure.
  //
  MultiFab&   S_new    = get_new_data(State_Type);
  MultiFab&   P_new    = get_new_data(Press_Type);

  // If the user provide an initDataPlt, fill the data from there.
  ParmParse pp("peleLM");
  if (pp.countval("initDataPlt") > 0) {

    //
    // This code has a few drawbacks.  It assumes that the physical
    // domain size of the current problem is the same as that of the
    // one that generated the pltfile.  It also assumes that the pltfile
    // has at least as many levels as does the current problem.  If
    // either of these are false this code is likely to core dump.
    //
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    std::string pltfile;
    pp.query("initDataPlt", pltfile);
    if (verbose)
      amrex::Print() << "initData: reading data from: " << pltfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(pltfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idT = -1, idX = -1, idY = -1, nSpecPlt = 0;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      std::string firstChars = plotnames[i].substr(0, 2);
      if (plotnames[i] == "temp")       idT = i;
      if (plotnames[i] == "x_velocity") idX = i;
      if (firstChars == "Y(")     nSpecPlt += 1;
      if (firstChars == "Y(" && idY < 0 ) {  // species might not be ordered in the order of the current mech.
        idY = i;
      }
    }
    //
    // In the plotfile the mass fractions directly follow the velocities.
    //
    int idSpec = idX + AMREX_SPACEDIM;
 
    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, Xvel, AMREX_SPACEDIM,
                             S_new);

    // Temperature
    pltData.fillPatchFromPlt(level, geom, idT, Temp, 1,
                             S_new);

    // Species
    // Hold the species in temporary MF before copying to level data
    // in case the number of species differs.
    MultiFab speciesPlt(grids, dmap, nSpecPlt, 0); 
    pltData.fillPatchFromPlt(level, geom, idSpec, 0, nSpecPlt,
                             speciesPlt);
    for (int i = 0; i < NUM_SPECIES; i++) {
       std::string specString = "Y("+spec_names[i]+")";
       int foundSpec = 0;
       for (int iplt = 0; iplt < nSpecPlt; iplt++) {
          if ( specString == plotnames[idY+iplt] ) {
             MultiFab::Copy(S_new, speciesPlt, iplt, DEF_first_spec+i, 1, 0);
             foundSpec = 1;
          }
       }
       if (!foundSpec) S_new.setVal(0.0,DEF_first_spec+i,1);
    }

    if (verbose) amrex::Print() << "initData: finished init from pltfile" << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
      const Box& box = mfi.tilebox();
      auto const& snew_arr = S_new.array(mfi);
      ProbParm const* lprobparm = prob_parm_d;

      amrex::ParallelFor(box,
      [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
        amrex::Real massfrac[NUM_SPECIES] = {0.0};
        for (int n = 0; n < NUM_SPECIES; n++) {
          massfrac[n] = snew_arr(i,j,k,DEF_first_spec+n);
        }
        auto eos = pele::physics::PhysicsType::eos();

        amrex::Real rho_cgs, P_cgs;
        P_cgs = lprobparm->P_mean * 10.0;

        eos.PYT2R(P_cgs, massfrac, snew_arr(i,j,k,DEF_Temp), rho_cgs);
        snew_arr(i,j,k,Density) = rho_cgs * 1.0e3;            // CGS -> MKS conversion

        eos.TY2H(snew_arr(i,j,k,DEF_Temp), massfrac, snew_arr(i,j,k,DEF_RhoH));
        snew_arr(i,j,k,DEF_RhoH) = snew_arr(i,j,k,DEF_RhoH) * 1.0e-4 * snew_arr(i,j,k,Density);   // CGS -> MKS conversion

        for (int n = 0; n < NUM_SPECIES; n++) {
          snew_arr(i,j,k,DEF_first_spec+n) = massfrac[n] * snew_arr(i,j,k,Density);
        }
      });
    }
  }
  else {
    const auto geomdata = geom.data();
    S_new.setVal(0.0);
    P_new.setVal(0.0);

    ProbParm const* lprobparm = prob_parm_d;
    pele::physics::PMF::PmfData::DataContainer const* lpmfdata = pmf_data.getDeviceData();

    auto const& sma = S_new.arrays();
    amrex::ParallelFor(S_new,
    [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
    {
       pelelm_initdata(i, j, k, sma[box_no], geomdata, *lprobparm, lpmfdata);
    });
  }

  showMFsub("1D",S_new,stripBox,"1D_S",level);

  //
  // Initialize GradP
  //
  computeGradP(state[Press_Type].curTime());

  //
  // We might want to add the velocity from the supplied plotfile
  // to what we already put into the velocity field via init_data
  //
  std::string velocity_plotfile;
  pp.query("initVelocityPlt", velocity_plotfile);

  if (!velocity_plotfile.empty()) {
    if (verbose)
      amrex::Print() << "initData: reading velocity from: " << velocity_plotfile << '\n';

    // Use PelePhysics PltFileManager
    pele::physics::pltfilemanager::PltFileManager pltData(velocity_plotfile); 
    Vector<std::string>  plotnames   = pltData.getVariableList();

    // Find required data in pltfile
    Vector<std::string> names;
    pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);

    int idX = -1;
    for (int i = 0; i < plotnames.size(); ++i)
    {
      if (plotnames[i] == "x_velocity") idX = i;
    }
    if (idX == -1)
      amrex::Abort("Could not find velocity fields in supplied peleLM.initVelocityPlt");
 
    MultiFab tmp(S_new.boxArray(), S_new.DistributionMap(), 1, 0);

    // Velocity
    pltData.fillPatchFromPlt(level, geom, idX, 0, AMREX_SPACEDIM,
                             tmp);
    MultiFab::Add(S_new,tmp,0,Xvel,AMREX_SPACEDIM,0);

    if (verbose)
      amrex::Print() << "initData: finished init from peleLM.initVelocityPlt" << '\n';
  }

  make_rho_prev_time();
  make_rho_curr_time();

  //
  // Initialize other types (RhoRT, divu, ...)
  //
  initDataOtherTypes();

  // Initialize state for EB covered regions.
#ifdef AMREX_USE_EB
  set_body_state(S_new);
#endif

  //
  // Load typical values for each state component
  //
  set_typical_values(false);

  //
  // Initialize mixture fraction data.
  //
  init_mixture_fraction();

  //
  // Initialize active control
  //
  initActiveControl();

#ifdef AMREX_USE_EB
  //
  // Perform redistribution on initial fields
  // This changes the input velocity fields
  //
  InitialRedistribution();
  set_body_state(S_new);
#endif

  //
  // Initialize divU
  //
  if (have_divu)
  {
    const Real dt       = 1.0;
    const Real dtin     = -1.0; // Dummy value denotes initialization.
    const Real new_time = state[Divu_Type].curTime();
    MultiFab&  Divu_new = get_new_data(Divu_Type);

    state[State_Type].setTimeLevel(new_time, dt, dt);

    // calcDiff uses class state and assumes FillPatched -> do it now
    FillPatch(*this, S_new, S_new.nGrow(), new_time , State_Type, Density, NUM_STATE-(Density+1), Density);
    calcDiffusivity(new_time);

    calc_divu(new_time, dtin, Divu_new);
  }

  old_intersect_new = grids;

#ifdef AMREX_PARTICLES
  NavierStokesBase::initParticleData();
#endif
}